

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arbitrary.h
# Opt level: O0

pair<std::array<ArbitraryTestsFixtures::UserDefinedType,_2UL>,_std::vector<ArbitraryTestsFixtures::UserDefinedType,_std::allocator<ArbitraryTestsFixtures::UserDefinedType>_>_>
* cppqc::detail::
  ArbitraryPair<std::pair<std::array<ArbitraryTestsFixtures::UserDefinedType,_2UL>,_std::vector<ArbitraryTestsFixtures::UserDefinedType,_std::allocator<ArbitraryTestsFixtures::UserDefinedType>_>_>_>
  ::unGen(RngEngine *rng,size_t size)

{
  RngEngine *in_RDI;
  RngEngine *rng_00;
  pair<std::array<ArbitraryTestsFixtures::UserDefinedType,_2UL>,_std::vector<ArbitraryTestsFixtures::UserDefinedType,_std::allocator<ArbitraryTestsFixtures::UserDefinedType>_>_>
  *in_stack_ffffffffffffff80;
  
  rng_00 = in_RDI;
  Arbitrary<std::array<ArbitraryTestsFixtures::UserDefinedType,_2UL>_>::unGen(in_RDI,(size_t)in_RDI)
  ;
  Arbitrary<std::vector<ArbitraryTestsFixtures::UserDefinedType,_std::allocator<ArbitraryTestsFixtures::UserDefinedType>_>_>
  ::unGen(rng_00,(size_t)in_RDI);
  std::
  pair<std::array<ArbitraryTestsFixtures::UserDefinedType,_2UL>,_std::vector<ArbitraryTestsFixtures::UserDefinedType,_std::allocator<ArbitraryTestsFixtures::UserDefinedType>_>_>
  ::
  pair<std::array<ArbitraryTestsFixtures::UserDefinedType,_2UL>,_std::vector<ArbitraryTestsFixtures::UserDefinedType,_std::allocator<ArbitraryTestsFixtures::UserDefinedType>_>,_true>
            (in_stack_ffffffffffffff80,(array<ArbitraryTestsFixtures::UserDefinedType,_2UL> *)rng_00
             ,(vector<ArbitraryTestsFixtures::UserDefinedType,_std::allocator<ArbitraryTestsFixtures::UserDefinedType>_>
               *)in_RDI);
  std::
  vector<ArbitraryTestsFixtures::UserDefinedType,_std::allocator<ArbitraryTestsFixtures::UserDefinedType>_>
  ::~vector((vector<ArbitraryTestsFixtures::UserDefinedType,_std::allocator<ArbitraryTestsFixtures::UserDefinedType>_>
             *)in_stack_ffffffffffffff80);
  std::array<ArbitraryTestsFixtures::UserDefinedType,_2UL>::~array
            (&in_stack_ffffffffffffff80->first);
  return (pair<std::array<ArbitraryTestsFixtures::UserDefinedType,_2UL>,_std::vector<ArbitraryTestsFixtures::UserDefinedType,_std::allocator<ArbitraryTestsFixtures::UserDefinedType>_>_>
          *)rng_00;
}

Assistant:

static PairType unGen(RngEngine& rng, std::size_t size) {
    return PairType(
        Arbitrary<typename PairType::first_type>::unGen(rng, size),
        Arbitrary<typename PairType::second_type>::unGen(rng, size));
  }